

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlInitIOCallbacks(void)

{
  xmlInputCallbackNr = 1;
  xmlInputCallbackTable[0].matchcallback = xmlIODefaultMatch;
  xmlOutputCallbackNr = 1;
  xmlOutputCallbackTable[0].matchcallback = xmlIODefaultMatch;
  return;
}

Assistant:

void
xmlInitIOCallbacks(void)
{
    xmlInputCallbackNr = 1;
    xmlInputCallbackTable[0].matchcallback = xmlIODefaultMatch;

#ifdef LIBXML_OUTPUT_ENABLED
    xmlOutputCallbackNr = 1;
    xmlOutputCallbackTable[0].matchcallback = xmlIODefaultMatch;
#endif
}